

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.cpp
# Opt level: O2

RealType __thiscall
QuantLib::Problem::computeGradientNormValue
          (Problem *this,DynamicVector<double,_std::allocator<double>_> *grad_f)

{
  double dVar1;
  
  dVar1 = OpenMD::DynamicVector<double,_std::allocator<double>_>::lengthSquare(grad_f);
  return dVar1;
}

Assistant:

RealType Problem::computeGradientNormValue(DynamicVector<RealType>& grad_f) {
    RealType dot = grad_f.lengthSquare();
    return dot;
  }